

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O3

bool __thiscall
NJamSpell::TSpellCorrector::TrainLangModel
          (TSpellCorrector *this,string *textFile,string *alphabetFile,string *modelFile)

{
  pointer pcVar1;
  bool bVar2;
  undefined1 local_40 [8];
  string cacheFile;
  
  bVar2 = TLangModel::Train(&this->LangModel,textFile,alphabetFile);
  if (bVar2) {
    PrepareCache(this);
    bVar2 = TLangModel::Dump(&this->LangModel,modelFile);
    if (bVar2) {
      pcVar1 = (modelFile->_M_dataplus)._M_p;
      local_40 = (undefined1  [8])&cacheFile._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,pcVar1,pcVar1 + modelFile->_M_string_length);
      std::__cxx11::string::append((char *)local_40);
      bVar2 = SaveCache(this,(string *)local_40);
      if (local_40 == (undefined1  [8])&cacheFile._M_string_length) {
        return bVar2;
      }
      operator_delete((void *)local_40);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool TSpellCorrector::TrainLangModel(const std::string& textFile, const std::string& alphabetFile, const std::string& modelFile) {
    if (!LangModel.Train(textFile, alphabetFile)) {
        return false;
    }
    PrepareCache();
    if (!LangModel.Dump(modelFile)) {
        return false;
    }
    std::string cacheFile = modelFile + ".spell";
    if (!SaveCache(cacheFile)) {
        return false;
    }
    return true;
}